

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O3

char * lj_debug_funcname(lua_State *L,cTValue *frame,char **name)

{
  cTValue *nextframe;
  ulong uVar1;
  BCPos BVar2;
  uint uVar3;
  cTValue *pcVar4;
  char *pcVar5;
  uint uVar6;
  BCReg slot;
  uint uVar7;
  long lVar8;
  
  if ((cTValue *)((L->stack).ptr64 + 8) < frame) {
    lVar8 = 0;
    if (((frame->u32).lo & 7) == 3) {
      lVar8 = -((ulong)frame->u32 & 0xfffffffffffffff8);
    }
    nextframe = (cTValue *)((long)frame + lVar8);
    uVar1 = *(ulong *)((long)frame + lVar8);
    if ((uVar1 & 3) == 0) {
      pcVar4 = nextframe + (-2 - (ulong)*(byte *)(uVar1 - 3));
    }
    else {
      pcVar4 = (cTValue *)((long)nextframe - (uVar1 & 0xfffffffffffffff8));
    }
    uVar1 = pcVar4[-1].u64;
    BVar2 = debug_framepc(L,(GCfunc *)(uVar1 & 0x7fffffffffff),nextframe);
    if (BVar2 != 0xffffffff) {
      lVar8 = *(long *)((long)(uVar1 & 0x7fffffffffff) + 0x20);
      uVar6 = *(uint *)(lVar8 + (ulong)BVar2 * 4);
      uVar3 = uVar6 & 0xff;
      uVar7 = (uint)(lj_bc_mode[uVar3] >> 0xb);
      if (uVar7 != 0x16) {
        if (uVar7 != 9) {
          *name = (char *)(*(long *)((L->glref).ptr64 + 0x1a8 + (ulong)uVar7 * 8) + 0x18);
          return "metamethod";
        }
        uVar6 = uVar6 >> 8 & 0xff;
        slot = uVar6 - 3;
        if (uVar3 != 0x45) {
          slot = uVar6;
        }
        pcVar5 = lj_debug_slotname((GCproto *)(lVar8 + -0x68),(BCIns *)(lVar8 + (ulong)BVar2 * 4),
                                   slot,name);
        return pcVar5;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *lj_debug_funcname(lua_State *L, cTValue *frame, const char **name)
{
  cTValue *pframe;
  GCfunc *fn;
  BCPos pc;
  if (frame <= tvref(L->stack)+LJ_FR2)
    return NULL;
  if (frame_isvarg(frame))
    frame = frame_prevd(frame);
  pframe = frame_prev(frame);
  fn = frame_func(pframe);
  pc = debug_framepc(L, fn, frame);
  if (pc != NO_BCPOS) {
    GCproto *pt = funcproto(fn);
    const BCIns *ip = &proto_bc(pt)[check_exp(pc < pt->sizebc, pc)];
    MMS mm = bcmode_mm(bc_op(*ip));
    if (mm == MM_call) {
      BCReg slot = bc_a(*ip);
      if (bc_op(*ip) == BC_ITERC) slot -= 3;
      return lj_debug_slotname(pt, ip, slot, name);
    } else if (mm != MM__MAX) {
      *name = strdata(mmname_str(G(L), mm));
      return "metamethod";
    }
  }
  return NULL;
}